

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O1

bool __thiscall ELFIO::elfio::is_section_without_segment(elfio *this,uint section_index)

{
  elfio *peVar1;
  __uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_> _Var2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ulong uVar7;
  bool bVar8;
  
  peVar1 = (this->segments).parent;
  if ((*(int *)&(peVar1->segments_).
                super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
       *(int *)&(peVar1->segments_).
                super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start & 0x7fff8U) == 0) {
    bVar8 = true;
  }
  else {
    bVar8 = false;
    uVar7 = 0;
    do {
      if (!bVar8) {
        sVar3 = (**(code **)(*(long *)(((this->segments).parent)->segments_).
                                      super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_t.
                                      super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>
                                      ._M_t + 0xb0))();
        if (sVar3 != 0) {
          uVar6 = 0;
          do {
            _Var2._M_t.
            super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
            super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl =
                 (((this->segments).parent)->segments_).
                 super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_t.
                 super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>._M_t;
            uVar4 = (**(code **)(*(long *)_Var2._M_t.
                                          super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>
                                          .super__Head_base<0UL,_ELFIO::segment_*,_false>.
                                          _M_head_impl + 0xb8))
                              (_Var2._M_t.
                               super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>
                               .super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl,uVar6);
            if (uVar4 == section_index) break;
            uVar6 = uVar6 + 1;
            uVar5 = (**(code **)(*(long *)(((this->segments).parent)->segments_).
                                          super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_t.
                                          super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>
                                          ._M_t + 0xb0))();
          } while (uVar6 < uVar5);
          bVar8 = uVar4 == section_index;
        }
      }
      if (bVar8 != false) break;
      peVar1 = (this->segments).parent;
      uVar7 = uVar7 + 1;
    } while (uVar7 < ((ulong)((uint)(*(int *)&(peVar1->segments_).
                                              super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                    *(int *)&(peVar1->segments_).
                                             super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) &
                     0xffff));
    bVar8 = (bool)(bVar8 ^ 1);
  }
  return bVar8;
}

Assistant:

Elf_Half size() const
        {
            return static_cast<Elf_Half>( parent->segments_.size() );
        }